

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O0

void kv_init_ops_test(void)

{
  int iVar1;
  btree_kv_ops *__s1;
  btree_kv_ops *__s2;
  btree_kv_ops *kv_ops_copy;
  btree_kv_ops *kv_ops;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  btree_kv_ops *in_stack_ffffffffffffffa0;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  memleak_start();
  __s1 = btree_str_kv_get_kb64_vb64(in_stack_ffffffffffffffa0);
  if (__s1 == (btree_kv_ops *)0x0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x9e);
    kv_init_ops_test::__test_pass = 0;
    __assert_fail("kv_ops != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                  ,0x9e,"void kv_init_ops_test()");
  }
  __s2 = btree_str_kv_get_kb64_vb64(in_stack_ffffffffffffffa0);
  if (((__s1 != (btree_kv_ops *)0x0) && (__s2 != (btree_kv_ops *)0x0)) &&
     (iVar1 = memcmp(__s1,__s2,0x78), iVar1 != 0)) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0xa3);
    kv_init_ops_test::__test_pass = 0;
    iVar1 = memcmp(__s1,__s2,0x78);
    if (iVar1 != 0) {
      __assert_fail("memcmp(kv_ops, kv_ops_copy, sizeof(btree_kv_ops)) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0xa3,"void kv_init_ops_test()");
    }
  }
  free(__s1);
  memleak_end();
  if (kv_init_ops_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","kv init ops test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","kv init ops test");
  }
  return;
}

Assistant:

void kv_init_ops_test()
{
    TEST_INIT();
    memleak_start();

    // init with null
    btree_kv_ops *kv_ops = btree_str_kv_get_kb64_vb64(NULL);
    TEST_CHK(kv_ops != NULL);

    // re-init with existing ops
    btree_kv_ops *kv_ops_copy =  btree_str_kv_get_kb64_vb64(kv_ops);
    if (kv_ops && kv_ops_copy) {
        TEST_CHK(memcmp(kv_ops, kv_ops_copy, sizeof(btree_kv_ops)) == 0);
    }

    free(kv_ops);
    memleak_end();
    TEST_RESULT("kv init ops test");
}